

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O1

void __thiscall
duckdb::LocalTableStorage::AppendToDeleteIndexes
          (LocalTableStorage *this,Vector *row_ids,DataChunk *delete_chunk)

{
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *puVar1;
  int iVar2;
  pointer pIVar3;
  undefined4 extraout_var;
  BoundIndex *this_00;
  InternalException *this_01;
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *this_02;
  IndexAppendInfo index_append_info;
  ErrorData result;
  IndexAppendInfo local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  undefined1 local_b0 [128];
  
  if (delete_chunk->count != 0) {
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->delete_indexes);
    if (iVar2 != 0) {
      ::std::__throw_system_error(iVar2);
    }
    puVar1 = (this->delete_indexes).indexes.
             super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_02 = (this->delete_indexes).indexes.
                   super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_02 != puVar1;
        this_02 = this_02 + 1) {
      pIVar3 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
                         (this_02);
      iVar2 = (*pIVar3->_vptr_Index[2])(pIVar3);
      if ((char)iVar2 != '\0') {
        pIVar3 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
                           (this_02);
        iVar2 = (*pIVar3->_vptr_Index[3])(pIVar3);
        iVar2 = ::std::__cxx11::string::compare((char *)CONCAT44(extraout_var,iVar2));
        if (iVar2 == 0) {
          this_00 = (BoundIndex *)
                    unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
                              (this_02);
          iVar2 = (*(this_00->super_Index)._vptr_Index[5])(this_00);
          if ((byte)((char)iVar2 - 1U) < 2) {
            local_100.append_mode = IGNORE_DUPLICATES;
            local_100.delete_index.ptr = (BoundIndex *)0x0;
            BoundIndex::Append((ErrorData *)local_b0,this_00,delete_chunk,row_ids,&local_100);
            if ((bool)local_b0[0] == true) {
              this_01 = (InternalException *)__cxa_allocate_exception(0x10);
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_d0,"unexpected constraint violation on delete ART: ","");
              local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_f0,local_b0._40_8_,
                         (pointer)(local_b0._40_8_ + local_b0._48_8_));
              InternalException::InternalException<std::__cxx11::string>
                        (this_01,&local_d0,&local_f0);
              __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error)
              ;
            }
            ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)(local_b0 + 0x48));
            if ((undefined1 *)local_b0._40_8_ != local_b0 + 0x38) {
              operator_delete((void *)local_b0._40_8_);
            }
            if ((undefined1 *)local_b0._8_8_ != local_b0 + 0x18) {
              operator_delete((void *)local_b0._8_8_);
            }
          }
        }
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->delete_indexes);
  }
  return;
}

Assistant:

void LocalTableStorage::AppendToDeleteIndexes(Vector &row_ids, DataChunk &delete_chunk) {
	if (delete_chunk.size() == 0) {
		return;
	}

	delete_indexes.ScanBound<ART>([&](ART &art) {
		if (!art.IsUnique()) {
			return false;
		}
		IndexAppendInfo index_append_info(IndexAppendMode::IGNORE_DUPLICATES, nullptr);
		auto result = art.Cast<BoundIndex>().Append(delete_chunk, row_ids, index_append_info);
		if (result.HasError()) {
			throw InternalException("unexpected constraint violation on delete ART: ", result.Message());
		}
		return false;
	});
}